

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O1

void main_cold_2(void)

{
  fprintf(_stderr,"\nERROR: %s() failed - returned NULL pointer\n\n","N_VNew_Serial");
  return;
}

Assistant:

static int check_flag(void *flagvalue, const char *funcname, int opt)
{
  int *errflag;

  /* Check if function returned NULL pointer - no memory allocated */
  if (opt==0 && flagvalue==NULL) {
    fprintf(stderr, "\nERROR: %s() failed - returned NULL pointer\n\n",
	    funcname);
    return 1; }

  /* Check if flag != 0 */
  if (opt==1) {
    errflag = (int *) flagvalue;
    if (*errflag != 0) {
      fprintf(stderr, "\nERROR: %s() failed with flag = %d\n\n",
	      funcname, *errflag);
      return 1; }}

  return 0;
}